

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

void __thiscall
cmGraphVizWriter::ReadSettings
          (cmGraphVizWriter *this,char *settingsFileName,char *fallbackSettingsFileName)

{
  cmMakefile *this_00;
  char *pcVar1;
  pointer pcVar2;
  Snapshot snapshot;
  size_type sVar3;
  bool bVar4;
  size_t sVar5;
  char *pcVar6;
  ostream *poVar7;
  pointer pbVar8;
  RegularExpression currentRegex;
  string currentRegexString;
  string ignoreTargetsRegexes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreTargetsRegExVector;
  cmGlobalGenerator ggi;
  cmake cm;
  undefined1 local_9a0 [184];
  char *local_8e8;
  cmLocalGenerator *local_8d0;
  long *local_8c8;
  long local_8c0;
  long local_8b8 [2];
  string local_8a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_888;
  Snapshot local_870;
  undefined1 local_858 [1480];
  cmake local_290;
  
  cmake::cmake(&local_290);
  pcVar2 = local_858 + 0x10;
  local_858._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_858,"");
  cmake::SetHomeDirectory(&local_290,(string *)local_858);
  if ((pointer)local_858._0_8_ != pcVar2) {
    operator_delete((void *)local_858._0_8_,local_858._16_8_ + 1);
  }
  local_858._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_858,"");
  cmake::SetHomeOutputDirectory(&local_290,(string *)local_858);
  if ((pointer)local_858._0_8_ != pcVar2) {
    operator_delete((void *)local_858._0_8_,local_858._16_8_ + 1);
  }
  cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)local_858,&local_290);
  cmState::Snapshot::Snapshot(&local_870,(cmState *)0x0,(PositionType)ZEXT816(0));
  snapshot.Position.Tree = local_870.Position.Tree;
  snapshot.State = local_870.State;
  snapshot.Position.Position = local_870.Position.Position;
  local_8d0 = cmGlobalGenerator::MakeLocalGenerator
                        ((cmGlobalGenerator *)local_858,snapshot,(cmLocalGenerator *)0x0);
  this_00 = local_8d0->Makefile;
  bVar4 = cmsys::SystemTools::FileExists(settingsFileName);
  if (!bVar4) {
    bVar4 = cmsys::SystemTools::FileExists(fallbackSettingsFileName);
    settingsFileName = fallbackSettingsFileName;
    if (!bVar4) goto LAB_003ebbb9;
  }
  bVar4 = cmMakefile::ReadListFile(this_00,settingsFileName);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Reading GraphViz options file: ",0x1f);
    if (settingsFileName == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x609740);
    }
    else {
      sVar5 = strlen(settingsFileName);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,settingsFileName,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    pcVar2 = local_9a0 + 0x10;
    local_9a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9a0,"GRAPHVIZ_GRAPH_TYPE","");
    pcVar6 = cmMakefile::GetDefinition(this_00,(string *)local_9a0);
    if ((pointer)local_9a0._0_8_ != pcVar2) {
      operator_delete((void *)local_9a0._0_8_,local_9a0._16_8_ + 1);
    }
    if (pcVar6 != (char *)0x0) {
      pcVar1 = (char *)(this->GraphType)._M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,(ulong)pcVar6);
    }
    local_9a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9a0,"GRAPHVIZ_GRAPH_NAME","");
    pcVar6 = cmMakefile::GetDefinition(this_00,(string *)local_9a0);
    if ((pointer)local_9a0._0_8_ != pcVar2) {
      operator_delete((void *)local_9a0._0_8_,local_9a0._16_8_ + 1);
    }
    if (pcVar6 != (char *)0x0) {
      pcVar1 = (char *)(this->GraphName)._M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)&this->GraphName,0,pcVar1,(ulong)pcVar6);
    }
    local_9a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9a0,"GRAPHVIZ_GRAPH_HEADER","");
    pcVar6 = cmMakefile::GetDefinition(this_00,(string *)local_9a0);
    if ((pointer)local_9a0._0_8_ != pcVar2) {
      operator_delete((void *)local_9a0._0_8_,local_9a0._16_8_ + 1);
    }
    if (pcVar6 != (char *)0x0) {
      pcVar1 = (char *)(this->GraphHeader)._M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)&this->GraphHeader,0,pcVar1,(ulong)pcVar6);
    }
    local_9a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9a0,"GRAPHVIZ_NODE_PREFIX","");
    pcVar6 = cmMakefile::GetDefinition(this_00,(string *)local_9a0);
    if ((pointer)local_9a0._0_8_ != pcVar2) {
      operator_delete((void *)local_9a0._0_8_,local_9a0._16_8_ + 1);
    }
    if (pcVar6 != (char *)0x0) {
      pcVar1 = (char *)(this->GraphNodePrefix)._M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)&this->GraphNodePrefix,0,pcVar1,(ulong)pcVar6);
    }
    local_9a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9a0,"GRAPHVIZ_EXECUTABLES","");
    pcVar6 = cmMakefile::GetDefinition(this_00,(string *)local_9a0);
    if ((pointer)local_9a0._0_8_ != pcVar2) {
      operator_delete((void *)local_9a0._0_8_,local_9a0._16_8_ + 1);
    }
    if (pcVar6 != (char *)0x0) {
      local_9a0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9a0,"GRAPHVIZ_EXECUTABLES","")
      ;
      bVar4 = cmMakefile::IsOn(this_00,(string *)local_9a0);
      this->GenerateForExecutables = bVar4;
      if ((pointer)local_9a0._0_8_ != pcVar2) {
        operator_delete((void *)local_9a0._0_8_,local_9a0._16_8_ + 1);
      }
    }
    local_9a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9a0,"GRAPHVIZ_STATIC_LIBS","");
    pcVar6 = cmMakefile::GetDefinition(this_00,(string *)local_9a0);
    if ((pointer)local_9a0._0_8_ != pcVar2) {
      operator_delete((void *)local_9a0._0_8_,local_9a0._16_8_ + 1);
    }
    if (pcVar6 != (char *)0x0) {
      local_9a0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9a0,"GRAPHVIZ_STATIC_LIBS","")
      ;
      bVar4 = cmMakefile::IsOn(this_00,(string *)local_9a0);
      this->GenerateForStaticLibs = bVar4;
      if ((pointer)local_9a0._0_8_ != pcVar2) {
        operator_delete((void *)local_9a0._0_8_,local_9a0._16_8_ + 1);
      }
    }
    local_9a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9a0,"GRAPHVIZ_SHARED_LIBS","");
    pcVar6 = cmMakefile::GetDefinition(this_00,(string *)local_9a0);
    if ((pointer)local_9a0._0_8_ != pcVar2) {
      operator_delete((void *)local_9a0._0_8_,local_9a0._16_8_ + 1);
    }
    if (pcVar6 != (char *)0x0) {
      local_9a0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9a0,"GRAPHVIZ_SHARED_LIBS","")
      ;
      bVar4 = cmMakefile::IsOn(this_00,(string *)local_9a0);
      this->GenerateForSharedLibs = bVar4;
      if ((pointer)local_9a0._0_8_ != pcVar2) {
        operator_delete((void *)local_9a0._0_8_,local_9a0._16_8_ + 1);
      }
    }
    local_9a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9a0,"GRAPHVIZ_MODULE_LIBS","");
    pcVar6 = cmMakefile::GetDefinition(this_00,(string *)local_9a0);
    if ((pointer)local_9a0._0_8_ != pcVar2) {
      operator_delete((void *)local_9a0._0_8_,local_9a0._16_8_ + 1);
    }
    if (pcVar6 != (char *)0x0) {
      local_9a0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9a0,"GRAPHVIZ_MODULE_LIBS","")
      ;
      bVar4 = cmMakefile::IsOn(this_00,(string *)local_9a0);
      this->GenerateForModuleLibs = bVar4;
      if ((pointer)local_9a0._0_8_ != pcVar2) {
        operator_delete((void *)local_9a0._0_8_,local_9a0._16_8_ + 1);
      }
    }
    local_9a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9a0,"GRAPHVIZ_EXTERNAL_LIBS","")
    ;
    pcVar6 = cmMakefile::GetDefinition(this_00,(string *)local_9a0);
    if ((pointer)local_9a0._0_8_ != pcVar2) {
      operator_delete((void *)local_9a0._0_8_,local_9a0._16_8_ + 1);
    }
    if (pcVar6 != (char *)0x0) {
      local_9a0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_9a0,"GRAPHVIZ_EXTERNAL_LIBS","");
      bVar4 = cmMakefile::IsOn(this_00,(string *)local_9a0);
      this->GenerateForExternals = bVar4;
      if ((pointer)local_9a0._0_8_ != pcVar2) {
        operator_delete((void *)local_9a0._0_8_,local_9a0._16_8_ + 1);
      }
    }
    local_9a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_9a0,"GRAPHVIZ_GENERATE_PER_TARGET","");
    pcVar6 = cmMakefile::GetDefinition(this_00,(string *)local_9a0);
    if ((pointer)local_9a0._0_8_ != pcVar2) {
      operator_delete((void *)local_9a0._0_8_,local_9a0._16_8_ + 1);
    }
    if (pcVar6 != (char *)0x0) {
      local_9a0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_9a0,"GRAPHVIZ_GENERATE_PER_TARGET","");
      bVar4 = cmMakefile::IsOn(this_00,(string *)local_9a0);
      this->GeneratePerTarget = bVar4;
      if ((pointer)local_9a0._0_8_ != pcVar2) {
        operator_delete((void *)local_9a0._0_8_,local_9a0._16_8_ + 1);
      }
    }
    local_9a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_9a0,"GRAPHVIZ_GENERATE_DEPENDERS","");
    pcVar6 = cmMakefile::GetDefinition(this_00,(string *)local_9a0);
    if ((pointer)local_9a0._0_8_ != pcVar2) {
      operator_delete((void *)local_9a0._0_8_,local_9a0._16_8_ + 1);
    }
    if (pcVar6 != (char *)0x0) {
      local_9a0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_9a0,"GRAPHVIZ_GENERATE_DEPENDERS","");
      bVar4 = cmMakefile::IsOn(this_00,(string *)local_9a0);
      this->GenerateDependers = bVar4;
      if ((pointer)local_9a0._0_8_ != pcVar2) {
        operator_delete((void *)local_9a0._0_8_,local_9a0._16_8_ + 1);
      }
    }
    local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
    local_8a8._M_string_length = 0;
    local_8a8.field_2._M_local_buf[0] = '\0';
    local_9a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_9a0,"GRAPHVIZ_IGNORE_TARGETS","");
    pcVar6 = cmMakefile::GetDefinition(this_00,(string *)local_9a0);
    if ((pointer)local_9a0._0_8_ != pcVar2) {
      operator_delete((void *)local_9a0._0_8_,local_9a0._16_8_ + 1);
    }
    sVar3 = local_8a8._M_string_length;
    if (pcVar6 != (char *)0x0) {
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)&local_8a8,0,(char *)sVar3,(ulong)pcVar6);
    }
    std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
              (&this->TargetsToIgnoreRegex);
    if ((char *)local_8a8._M_string_length != (char *)0x0) {
      local_888.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_888.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_888.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandListArgument(&local_8a8,&local_888,false);
      if (local_888.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_888.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar8 = local_888.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          pcVar2 = (pbVar8->_M_dataplus)._M_p;
          local_8c8 = local_8b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_8c8,pcVar2,pcVar2 + pbVar8->_M_string_length);
          local_8e8 = (char *)0x0;
          bVar4 = cmsys::RegularExpression::compile
                            ((RegularExpression *)local_9a0,(char *)local_8c8);
          if (!bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Could not compile bad regex \"",0x1d);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_8c8,local_8c0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
          std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
          push_back(&this->TargetsToIgnoreRegex,(RegularExpression *)local_9a0);
          if (local_8e8 != (char *)0x0) {
            operator_delete__(local_8e8);
          }
          if (local_8c8 != local_8b8) {
            operator_delete(local_8c8,local_8b8[0] + 1);
          }
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 != local_888.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_888);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
      operator_delete(local_8a8._M_dataplus._M_p,
                      CONCAT71(local_8a8.field_2._M_allocated_capacity._1_7_,
                               local_8a8.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    cmSystemTools::Error
              ("Problem opening GraphViz options file: ",settingsFileName,(char *)0x0,(char *)0x0);
  }
LAB_003ebbb9:
  if (local_8d0 != (cmLocalGenerator *)0x0) {
    (*local_8d0->_vptr_cmLocalGenerator[1])();
  }
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)local_858);
  cmake::~cmake(&local_290);
  return;
}

Assistant:

void cmGraphVizWriter::ReadSettings(const char* settingsFileName,
                                    const char* fallbackSettingsFileName)
{
  cmake cm;
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cmGlobalGenerator ggi(&cm);
  cmsys::auto_ptr<cmLocalGenerator> lg(ggi.MakeLocalGenerator());
  cmMakefile *mf = lg->GetMakefile();

  const char* inFileName = settingsFileName;

  if ( !cmSystemTools::FileExists(inFileName) )
    {
    inFileName = fallbackSettingsFileName;
    if ( !cmSystemTools::FileExists(inFileName) )
      {
      return;
      }
    }

  if ( !mf->ReadListFile(inFileName) )
    {
    cmSystemTools::Error("Problem opening GraphViz options file: ",
                         inFileName);
    return;
    }

  std::cout << "Reading GraphViz options file: " << inFileName << std::endl;

#define __set_if_set(var, cmakeDefinition) \
  { \
  const char* value = mf->GetDefinition(cmakeDefinition); \
  if ( value ) \
    { \
    var = value; \
    } \
  }

  __set_if_set(this->GraphType, "GRAPHVIZ_GRAPH_TYPE");
  __set_if_set(this->GraphName, "GRAPHVIZ_GRAPH_NAME");
  __set_if_set(this->GraphHeader, "GRAPHVIZ_GRAPH_HEADER");
  __set_if_set(this->GraphNodePrefix, "GRAPHVIZ_NODE_PREFIX");

#define __set_bool_if_set(var, cmakeDefinition) \
  { \
  const char* value = mf->GetDefinition(cmakeDefinition); \
  if ( value ) \
    { \
    var = mf->IsOn(cmakeDefinition); \
    } \
  }

  __set_bool_if_set(this->GenerateForExecutables, "GRAPHVIZ_EXECUTABLES");
  __set_bool_if_set(this->GenerateForStaticLibs, "GRAPHVIZ_STATIC_LIBS");
  __set_bool_if_set(this->GenerateForSharedLibs, "GRAPHVIZ_SHARED_LIBS");
  __set_bool_if_set(this->GenerateForModuleLibs, "GRAPHVIZ_MODULE_LIBS");
  __set_bool_if_set(this->GenerateForExternals, "GRAPHVIZ_EXTERNAL_LIBS");
  __set_bool_if_set(this->GeneratePerTarget, "GRAPHVIZ_GENERATE_PER_TARGET");
  __set_bool_if_set(this->GenerateDependers, "GRAPHVIZ_GENERATE_DEPENDERS");

  std::string ignoreTargetsRegexes;
  __set_if_set(ignoreTargetsRegexes, "GRAPHVIZ_IGNORE_TARGETS");

  this->TargetsToIgnoreRegex.clear();
  if (!ignoreTargetsRegexes.empty())
    {
    std::vector<std::string> ignoreTargetsRegExVector;
    cmSystemTools::ExpandListArgument(ignoreTargetsRegexes,
                                      ignoreTargetsRegExVector);
    for(std::vector<std::string>::const_iterator itvIt
                                            = ignoreTargetsRegExVector.begin();
        itvIt != ignoreTargetsRegExVector.end();
        ++ itvIt )
      {
      std::string currentRegexString(*itvIt);
      cmsys::RegularExpression currentRegex;
      if (!currentRegex.compile(currentRegexString.c_str()))
        {
        std::cerr << "Could not compile bad regex \"" << currentRegexString
                  << "\"" << std::endl;
        }
      this->TargetsToIgnoreRegex.push_back(currentRegex);
      }
    }

}